

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

string * helics::logLevelToString_abi_cxx11_(LogLevels level)

{
  const_iterator cVar1;
  key_type in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  key_type local_34;
  string local_30;
  
  local_34 = in_ESI;
  cVar1 = std::
          _Rb_tree<helics::LogLevels,_std::pair<const_helics::LogLevels,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::_Select1st<std::pair<const_helics::LogLevels,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::less<helics::LogLevels>,_std::allocator<std::pair<const_helics::LogLevels,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ::find((_Rb_tree<helics::LogLevels,_std::pair<const_helics::LogLevels,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::_Select1st<std::pair<const_helics::LogLevels,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::less<helics::LogLevels>,_std::allocator<std::pair<const_helics::LogLevels,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  *)levelMaps,&local_34);
  if (cVar1._M_node == (_Base_ptr)(levelMaps + 8)) {
    std::__cxx11::to_string(&local_30,local_34);
    std::operator+(in_RDI,"loglevel_",&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)in_RDI,
               (basic_string_view<char,_std::char_traits<char>_> *)&cVar1._M_node[1]._M_parent,
               (allocator<char> *)&local_30);
  }
  return in_RDI;
}

Assistant:

std::string logLevelToString(LogLevels level)
{
    auto res = levelMaps.find(level);
    if (res != levelMaps.end()) {
        return std::string(res->second);
    }
    std::string ret = "loglevel_" + std::to_string(static_cast<int>(level));
    return ret;
}